

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPCnInp.cpp
# Opt level: O2

void __thiscall NaPetriCnInput::commit_data(NaPetriCnInput *this)

{
  int iVar1;
  NaPetriCnOutput *pNVar2;
  
  iVar1 = (*(this->super_NaPetriConnector)._vptr_NaPetriConnector[2])();
  if (0 < iVar1) {
    pNVar2 = adjoint(this);
    this->idData = pNVar2->idData;
    pNVar2 = adjoint(this);
    pNVar2->nPrCnt = pNVar2->nPrCnt + 1;
    NaPetriConnector::commit_data(&this->super_NaPetriConnector);
    return;
  }
  return;
}

Assistant:

void
NaPetriCnInput::commit_data ()
{
    if(links() > 0){
        idData = adjoint()->idData;     // Mark own data as old
        ++adjoint()->nPrCnt;            // One more processed connector

	NaPetriConnector::commit_data();
    }
}